

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteEqn.c
# Opt level: O2

void Io_WriteEqn(Abc_Ntk_t *pNtk,char *pFileName)

{
  Abc_Obj_t *pAVar1;
  byte *__s;
  size_t sVar2;
  ulong uVar3;
  FILE *__stream;
  char *pcVar4;
  long *plVar5;
  char *pcVar6;
  Vec_Ptr_t *p;
  void **ppvVar7;
  ProgressBar *p_00;
  Hop_Obj_t *pHVar8;
  ulong uVar9;
  int i_2;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int i;
  int iVar14;
  int iVar15;
  int i_1;
  
  if ((pNtk->ntkFunc != ABC_FUNC_AIG) || (pNtk->ntkType != ABC_NTK_NETLIST)) {
    __assert_fail("Abc_NtkIsAigNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteEqn.c"
                  ,0x36,"void Io_WriteEqn(Abc_Ntk_t *, char *)");
  }
  if (0 < pNtk->nObjCounts[8]) {
    puts("Warning: only combinational portion is being written.");
  }
  uVar11 = 0;
  while (iVar15 = (int)uVar11, iVar15 < pNtk->vObjs->nSize) {
    pAVar1 = Abc_NtkObj(pNtk,iVar15);
    if (pAVar1 != (Abc_Obj_t *)0x0) {
      __s = (byte *)Nm_ManFindNameById(pNtk->pManName,iVar15);
      if (__s != (byte *)0x0) {
        if ((*__s & 0xfe) == 0x30) {
LAB_002a7975:
          printf("The network cannot be written in the EQN format because object %d has name \"%s\".\n"
                 ,uVar11,__s);
          puts("Consider renaming the objects using command \"short_names\" and trying again.");
          return;
        }
        sVar2 = strlen((char *)__s);
        uVar3 = sVar2 & 0xffffffff;
        if ((int)sVar2 < 1) {
          uVar3 = 0;
        }
        for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
          if (((ulong)__s[uVar9] < 0x2c) &&
             ((0xf0200000000U >> ((ulong)__s[uVar9] & 0x3f) & 1) != 0)) goto LAB_002a7975;
        }
      }
    }
    uVar11 = (ulong)(iVar15 + 1);
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteEqn(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  pcVar6 = pNtk->pName;
  pcVar4 = Extra_TimeStamp();
  fprintf(__stream,"# Equations for \"%s\" written by ABC on %s\n",pcVar6,pcVar4);
  fwrite("INORDER =",9,1,__stream);
  iVar15 = 9;
  iVar12 = 0;
  iVar14 = 0;
  while( true ) {
    if (pNtk->vCis->nSize <= iVar14) break;
    plVar5 = (long *)Vec_PtrEntry(pNtk->vCis,iVar14);
    pAVar1 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8)
    ;
    pcVar6 = Abc_ObjName(pAVar1);
    sVar2 = strlen(pcVar6);
    iVar10 = (int)sVar2 + 1;
    if (iVar12 == 0) {
LAB_002a7a6c:
      iVar12 = 0;
    }
    else if (0x4b < iVar15 + iVar10) {
      fwrite(" \n",2,1,__stream);
      iVar15 = 0;
      goto LAB_002a7a6c;
    }
    pcVar6 = Abc_ObjName(pAVar1);
    fprintf(__stream," %s",pcVar6);
    iVar15 = iVar15 + iVar10;
    iVar12 = iVar12 + 1;
    iVar14 = iVar14 + 1;
  }
  fwrite(";\n",2,1,__stream);
  fwrite("OUTORDER =",10,1,__stream);
  iVar15 = 10;
  iVar12 = 0;
  iVar14 = 0;
  do {
    if (pNtk->vCos->nSize <= iVar14) {
      fwrite(";\n",2,1,__stream);
      p = (Vec_Ptr_t *)malloc(0x10);
      p->nCap = 10;
      p->nSize = 0;
      ppvVar7 = (void **)malloc(0x50);
      p->pArray = ppvVar7;
      p_00 = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
      for (iVar15 = 0; iVar15 < pNtk->vObjs->nSize; iVar15 = iVar15 + 1) {
        pAVar1 = Abc_NtkObj(pNtk,iVar15);
        if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
          if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= iVar15)) {
            Extra_ProgressBarUpdate_int(p_00,iVar15,(char *)0x0);
          }
          pcVar6 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanouts).pArray])
          ;
          fprintf(__stream,"%s = ",pcVar6);
          for (lVar13 = 0; lVar13 < (pAVar1->vFanins).nSize; lVar13 = lVar13 + 1) {
            pcVar6 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanins).pArray[lVar13]]);
            pHVar8 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,(int)lVar13);
            (pHVar8->field_0).pData = pcVar6;
          }
          Hop_ObjPrintEqn((FILE *)__stream,(Hop_Obj_t *)(pAVar1->field_5).pData,(Vec_Vec_t *)p,0);
          fwrite(";\n",2,1,__stream);
        }
      }
      Extra_ProgressBarStop(p_00);
      for (lVar13 = 0; lVar13 < p->nSize; lVar13 = lVar13 + 1) {
        if ((Vec_Ptr_t *)p->pArray[lVar13] != (Vec_Ptr_t *)0x0) {
          Vec_PtrFree((Vec_Ptr_t *)p->pArray[lVar13]);
        }
      }
      Vec_PtrFree(p);
      fputc(10,__stream);
      fclose(__stream);
      return;
    }
    plVar5 = (long *)Vec_PtrEntry(pNtk->vCos,iVar14);
    pAVar1 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8)
    ;
    pcVar6 = Abc_ObjName(pAVar1);
    sVar2 = strlen(pcVar6);
    iVar10 = (int)sVar2 + 1;
    if (iVar12 == 0) {
LAB_002a7b41:
      iVar12 = 0;
    }
    else if (0x4b < iVar15 + iVar10) {
      fwrite(" \n",2,1,__stream);
      iVar15 = 0;
      goto LAB_002a7b41;
    }
    pcVar6 = Abc_ObjName(pAVar1);
    fprintf(__stream," %s",pcVar6);
    iVar15 = iVar15 + iVar10;
    iVar12 = iVar12 + 1;
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

void Io_WriteEqn( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;

    assert( Abc_NtkIsAigNetlist(pNtk) );
    if ( Abc_NtkLatchNum(pNtk) > 0 )
        printf( "Warning: only combinational portion is being written.\n" );

    // check that the names are fine for the EQN format
    if ( !Io_NtkWriteEqnCheck(pNtk) )
        return;

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteEqn(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Equations for \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );

    // write the equations for the network
    Io_NtkWriteEqnOne( pFile, pNtk );
	fprintf( pFile, "\n" );
	fclose( pFile );
}